

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O1

void soul::throwInternalCompilerError(string *message)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  CompileMessage local_58;
  
  local_78[0] = local_68;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + message->_M_string_length);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x28820a);
  local_b8 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_b8 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_98 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_98 == plVar3) {
    local_88 = *plVar3;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar3;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x289133);
  local_58.description._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_58.description._M_dataplus._M_p == psVar4) {
    local_58.description.field_2._M_allocated_capacity = *psVar4;
    local_58.description.field_2._8_8_ = plVar2[3];
    local_58.description._M_dataplus._M_p = (pointer)&local_58.description.field_2;
  }
  else {
    local_58.description.field_2._M_allocated_capacity = *psVar4;
  }
  local_58.description._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_58.location.sourceCode.object = (SourceCodeText *)0x0;
  local_58.location.location.data = (char *)0x0;
  local_58.type = internalCompilerError;
  local_58.category = none;
  throwError(&local_58);
}

Assistant:

CompileMessageHandler::CompileMessageHandler (CompileMessageList& list)
    : CompileMessageHandler ([&] (const CompileMessageGroup& messageGroup)
                             {
                                 list.add (messageGroup);
                             })
{
}